

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O1

ssize_t ssl_cf_send(Curl_cfilter *cf,Curl_easy *data,void *buf,size_t len,_Bool eos,CURLcode *err)

{
  undefined8 uVar1;
  ssize_t sVar2;
  
  *err = CURLE_OK;
  if (len != 0) {
    uVar1 = *(undefined8 *)((long)cf->ctx + 0x38);
    *(Curl_easy **)((long)cf->ctx + 0x38) = data;
    sVar2 = (*Curl_ssl->send_plain)(cf,data,buf,len,err);
    *(undefined8 *)((long)cf->ctx + 0x38) = uVar1;
    return sVar2;
  }
  return 0;
}

Assistant:

static ssize_t ssl_cf_send(struct Curl_cfilter *cf,
                           struct Curl_easy *data, const void *buf, size_t len,
                           bool eos, CURLcode *err)
{
  struct cf_call_data save;
  ssize_t nwritten = 0;

  (void)eos;
  /* OpenSSL and maybe other TLS libs do not like 0-length writes. Skip. */
  *err = CURLE_OK;
  if(len > 0) {
    CF_DATA_SAVE(save, cf, data);
    nwritten = Curl_ssl->send_plain(cf, data, buf, len, err);
    CF_DATA_RESTORE(cf, save);
  }
  return nwritten;
}